

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multiheadattention_x86_avx.cpp
# Opt level: O3

int __thiscall
ncnn::MultiHeadAttention_x86_avx::destroy_pipeline(MultiHeadAttention_x86_avx *this,Option *opt)

{
  Layer *pLVar1;
  
  pLVar1 = this->q_gemm;
  if (pLVar1 != (Layer *)0x0) {
    (*pLVar1->_vptr_Layer[5])(pLVar1,opt);
    if (this->q_gemm != (Layer *)0x0) {
      (*this->q_gemm->_vptr_Layer[1])();
    }
    this->q_gemm = (Layer *)0x0;
  }
  pLVar1 = this->k_gemm;
  if (pLVar1 != (Layer *)0x0) {
    (*pLVar1->_vptr_Layer[5])(pLVar1,opt);
    if (this->k_gemm != (Layer *)0x0) {
      (*this->k_gemm->_vptr_Layer[1])();
    }
    this->k_gemm = (Layer *)0x0;
  }
  pLVar1 = this->v_gemm;
  if (pLVar1 != (Layer *)0x0) {
    (*pLVar1->_vptr_Layer[5])(pLVar1,opt);
    if (this->v_gemm != (Layer *)0x0) {
      (*this->v_gemm->_vptr_Layer[1])();
    }
    this->v_gemm = (Layer *)0x0;
  }
  pLVar1 = this->qk_gemm;
  if (pLVar1 != (Layer *)0x0) {
    (*pLVar1->_vptr_Layer[5])(pLVar1,opt);
    if (this->qk_gemm != (Layer *)0x0) {
      (*this->qk_gemm->_vptr_Layer[1])();
    }
    this->qk_gemm = (Layer *)0x0;
  }
  pLVar1 = this->qkv_gemm;
  if (pLVar1 != (Layer *)0x0) {
    (*pLVar1->_vptr_Layer[5])(pLVar1,opt);
    if (this->qkv_gemm != (Layer *)0x0) {
      (*this->qkv_gemm->_vptr_Layer[1])();
    }
    this->qkv_gemm = (Layer *)0x0;
  }
  pLVar1 = this->qk_softmax;
  if (pLVar1 != (Layer *)0x0) {
    (*pLVar1->_vptr_Layer[5])(pLVar1,opt);
    if (this->qk_softmax != (Layer *)0x0) {
      (*this->qk_softmax->_vptr_Layer[1])();
    }
    this->qk_softmax = (Layer *)0x0;
  }
  pLVar1 = this->o_gemm;
  if (pLVar1 != (Layer *)0x0) {
    (*pLVar1->_vptr_Layer[5])(pLVar1,opt);
    if (this->o_gemm != (Layer *)0x0) {
      (*this->o_gemm->_vptr_Layer[1])();
    }
    this->o_gemm = (Layer *)0x0;
  }
  return 0;
}

Assistant:

int MultiHeadAttention_x86_avx::destroy_pipeline(const Option& opt)
{
    if (q_gemm)
    {
        q_gemm->destroy_pipeline(opt);
        delete q_gemm;
        q_gemm = 0;
    }

    if (k_gemm)
    {
        k_gemm->destroy_pipeline(opt);
        delete k_gemm;
        k_gemm = 0;
    }

    if (v_gemm)
    {
        v_gemm->destroy_pipeline(opt);
        delete v_gemm;
        v_gemm = 0;
    }

    if (qk_gemm)
    {
        qk_gemm->destroy_pipeline(opt);
        delete qk_gemm;
        qk_gemm = 0;
    }
    if (qkv_gemm)
    {
        qkv_gemm->destroy_pipeline(opt);
        delete qkv_gemm;
        qkv_gemm = 0;
    }

    if (qk_softmax)
    {
        qk_softmax->destroy_pipeline(opt);
        delete qk_softmax;
        qk_softmax = 0;
    }

    if (o_gemm)
    {
        o_gemm->destroy_pipeline(opt);
        delete o_gemm;
        o_gemm = 0;
    }

    return 0;
}